

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetCreateRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  TargetType TVar5;
  long *plVar6;
  size_type *psVar7;
  string var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar5 = cmTarget::GetType(this->Target);
  switch(TVar5) {
  case EXECUTABLE:
    bVar4 = IsExecutableWithExports(this);
    if (bVar4) {
      std::operator+(&local_68,"CMAKE_",lang);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
      paVar1 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        lVar3 = plVar6[3];
        paVar1->_M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      bVar4 = cmMakefile::IsDefinitionSet(this->Makefile,__return_storage_ptr__);
      if (bVar4) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
    }
    std::operator+(&local_68,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
    break;
  case STATIC_LIBRARY:
    std::operator+(&local_48,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_68.field_2._M_allocated_capacity = *psVar7;
      local_68.field_2._8_8_ = plVar6[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar7;
      local_68._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_68._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    GetFeatureSpecificLinkRuleVariable(__return_storage_ptr__,this,&local_68,lang,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_004355cf;
  case SHARED_LIBRARY:
    std::operator+(&local_68,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
    break;
  case MODULE_LIBRARY:
    std::operator+(&local_68,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_004355cf:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCreateRuleVariable(
  std::string const& lang, std::string const& config) const
{
  switch (this->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      std::string var = "CMAKE_" + lang + "_CREATE_STATIC_LIBRARY";
      return this->GetFeatureSpecificLinkRuleVariable(var, lang, config);
    }
    case cmStateEnums::SHARED_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_LIBRARY";
    case cmStateEnums::MODULE_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_MODULE";
    case cmStateEnums::EXECUTABLE:
      if (this->IsExecutableWithExports()) {
        std::string linkExeWithExports =
          "CMAKE_" + lang + "_LINK_EXECUTABLE_WITH_EXPORTS";
        if (this->Makefile->IsDefinitionSet(linkExeWithExports)) {
          return linkExeWithExports;
        }
      }
      return "CMAKE_" + lang + "_LINK_EXECUTABLE";
    default:
      break;
  }
  return "";
}